

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int attrset_read_attr_set_v2(BigAttrSet *attrset,char *basename)

{
  char *pcVar1;
  int iVar2;
  uint nmemb_00;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  void *__ptr;
  void *__ptr_00;
  size_t sVar7;
  char *dtype_00;
  char *__nptr;
  char *__s;
  longlong lVar8;
  bool bVar9;
  char local_7b;
  char local_7a;
  undefined1 local_79;
  uint byte;
  int iStack_74;
  char buf [3];
  int k;
  int j;
  int itemsize;
  int nmemb;
  char *rawdata;
  char *rawlength;
  char *dtype;
  char *name;
  long i;
  uchar *data;
  char *buffer;
  long size;
  FILE *fattr;
  char *basename_local;
  BigAttrSet *attrset_local;
  
  attrset->dirty = 0;
  __stream = (FILE *)_big_file_open_a_file(basename,-3,"r",0);
  if (__stream == (FILE *)0x0) {
    attrset_local._4_4_ = 0;
  }
  else {
    fseek(__stream,0,2);
    sVar4 = ftell(__stream);
    if ((long)sVar4 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      _big_file_raise("ftell error: %s",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x5d9,pcVar6);
    }
    else {
      __ptr = malloc(sVar4 + 1);
      if (__ptr == (void *)0x0) {
        _big_file_raise("Could not allocate memory for buffer: %ld bytes",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x5db,sVar4 + 1);
      }
      else {
        __ptr_00 = malloc(sVar4 + 1);
        if (__ptr_00 == (void *)0x0) {
          _big_file_raise("Could not allocate memory for data: %ld bytes",
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x5dd,sVar4 + 1);
        }
        else {
          fseek(__stream,0,0);
          sVar7 = fread(__ptr,1,sVar4,__stream);
          if (sVar4 == sVar7) {
            *(undefined1 *)((long)__ptr + sVar4) = 0;
            name = (char *)0x0;
            do {
              if (*(char *)((long)__ptr + (long)name) == '\0') {
                fclose(__stream);
                free(__ptr_00);
                free(__ptr);
                attrset->dirty = 0;
                return 0;
              }
              while (iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name)), iVar2 != 0) {
                name = name + 1;
              }
              pcVar6 = (char *)((long)__ptr + (long)name);
              while (iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name)), iVar2 == 0) {
                name = name + 1;
              }
              *(char *)((long)__ptr + (long)name) = '\0';
              do {
                name = name + 1;
                iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name));
              } while (iVar2 != 0);
              dtype_00 = (char *)((long)__ptr + (long)name);
              while (iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name)), iVar2 == 0) {
                name = name + 1;
              }
              *(char *)((long)__ptr + (long)name) = '\0';
              do {
                name = name + 1;
                iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name));
              } while (iVar2 != 0);
              __nptr = (char *)((long)__ptr + (long)name);
              while (iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name)), iVar2 == 0) {
                name = name + 1;
              }
              *(char *)((long)__ptr + (long)name) = '\0';
              do {
                name = name + 1;
                iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name));
              } while (iVar2 != 0);
              __s = (char *)((long)__ptr + (long)name);
              while (iVar2 = _isblank((int)*(char *)((long)__ptr + (long)name)), iVar2 == 0) {
                name = name + 1;
              }
              *(char *)((long)__ptr + (long)name) = '\0';
              do {
                pcVar1 = name;
                name = pcVar1 + 1;
                bVar9 = false;
                if (*(char *)((long)__ptr + (long)name) != '\n') {
                  bVar9 = *(char *)((long)__ptr + (long)name) != '\0';
                }
              } while (bVar9);
              if (*(char *)((long)__ptr + (long)name) == '\n') {
                name = pcVar1 + 2;
              }
              nmemb_00 = atoi(__nptr);
              uVar3 = big_file_dtype_itemsize(dtype_00);
              sVar4 = strlen(__s);
              if ((long)(int)(nmemb_00 * uVar3 * 2) != sVar4) {
                sVar4 = strlen(__s);
                _big_file_raise("NMEMB and data mismiatch: %d x %d (%s) * 2 != %d",
                                "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                                ,0x5f8,(ulong)nmemb_00,(ulong)uVar3,dtype_00,sVar4);
                goto LAB_00104163;
              }
              iStack_74 = 0;
              for (byte = 0; (int)byte < (int)(nmemb_00 * uVar3); byte = byte + 1) {
                local_7b = __s[iStack_74];
                local_7a = __s[iStack_74 + 1];
                local_79 = 0;
                lVar8 = strtoll(&local_7b,(char **)0x0,0x10);
                *(char *)((long)__ptr_00 + (long)(int)byte) = (char)lVar8;
                iStack_74 = iStack_74 + 2;
              }
              iVar2 = attrset_set_attr(attrset,pcVar6,__ptr_00,dtype_00,nmemb_00);
            } while (iVar2 == 0);
            _big_file_raise((char *)0x0,
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x605);
          }
          else {
            _big_file_raise("Failed to read attribute file\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x5e1);
          }
LAB_00104163:
          attrset->dirty = 0;
          free(__ptr_00);
        }
        free(__ptr);
      }
    }
    fclose(__stream);
    attrset_local._4_4_ = -1;
  }
  return attrset_local._4_4_;
}

Assistant:

static int
attrset_read_attr_set_v2(BigAttrSet * attrset, const char * basename)
{
    attrset->dirty = 0;

    FILE * fattr = _big_file_open_a_file(basename, FILEID_ATTR_V2, "r", 0);
    if(fattr == NULL) {
        return 0;
    }
    fseek(fattr, 0, SEEK_END);
    long size = ftell(fattr);
    /*ftell may fail*/
    RAISEIF(size < 0, ex_init, "ftell error: %s",strerror(errno));
    char * buffer = (char*) malloc(size + 1);
    RAISEIF(!buffer, ex_init, "Could not allocate memory for buffer: %ld bytes",size+1);
    unsigned char * data = (unsigned char * ) malloc(size + 1);
    RAISEIF(!data, ex_data, "Could not allocate memory for data: %ld bytes",size+1);
    fseek(fattr, 0, SEEK_SET);
    RAISEIF(size != fread(buffer, 1, size, fattr),
            ex_read_file,
            "Failed to read attribute file\n");
    buffer[size] = 0;

    /* now parse the v2 attr file.*/
    long i = 0;
    #define ATTRV2_EXPECT(variable) while(_isblank(buffer[i])) i++; \
                    char * variable = buffer + i; \
                    while(!_isblank(buffer[i])) i++; buffer[i] = 0; i++;
    while(buffer[i]) {
        ATTRV2_EXPECT(name);
        ATTRV2_EXPECT(dtype);
        ATTRV2_EXPECT(rawlength);
        ATTRV2_EXPECT(rawdata);
        /* skip the reset of the line */
        while(buffer[i] != '\n' && buffer[i]) i ++;
        if(buffer[i] == '\n') i++;

        int nmemb = atoi(rawlength);
        int itemsize = big_file_dtype_itemsize(dtype);

        RAISEIF(nmemb * itemsize * 2!= strlen(rawdata),
            ex_parse_attr,
            "NMEMB and data mismiatch: %d x %d (%s) * 2 != %d",
            nmemb, itemsize, dtype, strlen(rawdata));

        int j, k;
        for(k = 0, j = 0; k < nmemb * itemsize; k ++, j += 2) {
            char buf[3];
            buf[0] = rawdata[j];
            buf[1] = rawdata[j+1];
            buf[2] = 0;
            unsigned int byte = strtoll(buf, NULL, 16);
            data[k] = byte;
        }
        RAISEIF(0 != attrset_set_attr(attrset, name, data, dtype, nmemb),
            ex_set_attr,
            NULL);
    } 
    fclose(fattr);
    free(data);
    free(buffer);
    attrset->dirty = 0;
    return 0;

ex_read_file:
ex_parse_attr:
ex_set_attr:
    attrset->dirty = 0;
    free(data);
ex_data:
    free(buffer);
ex_init:
    fclose(fattr);
    return -1;
}